

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplace_back<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *this,
          ValueSymbol **args,PortSymbol **args_1)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar9;
  long lVar10;
  
  lVar10 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  puVar8 = (undefined8 *)(lVar1 * 0x10 + lVar10);
  if (lVar1 != *(long *)(this + 0x10)) {
    *puVar8 = *args;
    puVar8[1] = *args_1;
    *(long *)(this + 8) = lVar1 + 1;
    return (reference)(lVar10 + (lVar1 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar2 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    pEVar9 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)puVar8 - *(long *)this;
  puVar4 = (undefined8 *)operator_new((long)pEVar9 << 4);
  *(ValueSymbol **)((long)puVar4 + lVar10) = *args;
  *(PortSymbol **)((long)puVar4 + lVar10 + 8) = *args_1;
  puVar7 = *(undefined8 **)this;
  puVar5 = puVar7 + *(long *)(this + 8) * 2;
  puVar6 = puVar4;
  if (puVar5 == puVar8) {
    for (; puVar7 != puVar8; puVar7 = puVar7 + 2) {
      uVar3 = puVar7[1];
      *puVar6 = *puVar7;
      puVar6[1] = uVar3;
      puVar6 = puVar6 + 2;
    }
  }
  else {
    for (; puVar7 != puVar8; puVar7 = puVar7 + 2) {
      uVar3 = puVar7[1];
      *puVar6 = *puVar7;
      puVar6[1] = uVar3;
      puVar6 = puVar6 + 2;
    }
    puVar7 = (undefined8 *)((long)puVar4 + lVar10);
    for (; puVar8 != puVar5; puVar8 = puVar8 + 2) {
      uVar3 = puVar8[1];
      puVar7[2] = *puVar8;
      puVar7[3] = uVar3;
      puVar7 = puVar7 + 2;
    }
  }
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::cleanup
            ((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)this,
             ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar9;
  *(undefined8 **)this = puVar4;
  return (reference)((long)puVar4 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }